

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

Text __thiscall loguru::ec_to_text(loguru *this,char c)

{
  char *pcVar1;
  anon_class_8_1_69789889 local_60;
  anon_class_8_1_69789889 write_hex_16;
  anon_class_8_1_ba1d7991 write_hex_digit;
  allocator<char> local_39;
  anon_class_8_1_ba1d7991 local_38;
  string str;
  char c_local;
  
  str.field_2._M_local_buf[0xf] = c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"\'",&local_39);
  std::allocator<char>::~allocator(&local_39);
  write_hex_16.write_hex_digit = &local_38;
  local_60.write_hex_digit = (anon_class_8_1_ba1d7991 *)&write_hex_16;
  if (str.field_2._M_local_buf[0xf] == '\\') {
    std::__cxx11::string::operator+=((string *)&local_38,"\\\\");
  }
  else if (str.field_2._M_local_buf[0xf] == '\"') {
    std::__cxx11::string::operator+=((string *)&local_38,"\\\"");
  }
  else if (str.field_2._M_local_buf[0xf] == '\'') {
    std::__cxx11::string::operator+=((string *)&local_38,"\\\'");
  }
  else if (str.field_2._M_local_buf[0xf] == '\0') {
    std::__cxx11::string::operator+=((string *)&local_38,"\\0");
  }
  else if (str.field_2._M_local_buf[0xf] == '\b') {
    std::__cxx11::string::operator+=((string *)&local_38,"\\b");
  }
  else if (str.field_2._M_local_buf[0xf] == '\f') {
    std::__cxx11::string::operator+=((string *)&local_38,"\\f");
  }
  else if (str.field_2._M_local_buf[0xf] == '\n') {
    std::__cxx11::string::operator+=((string *)&local_38,"\\n");
  }
  else if (str.field_2._M_local_buf[0xf] == '\r') {
    std::__cxx11::string::operator+=((string *)&local_38,"\\r");
  }
  else if (str.field_2._M_local_buf[0xf] == '\t') {
    std::__cxx11::string::operator+=((string *)&local_38,"\\t");
  }
  else if ((str.field_2._M_local_buf[0xf] < '\0') || ('\x1f' < str.field_2._M_local_buf[0xf])) {
    std::__cxx11::string::operator+=((string *)&local_38,str.field_2._M_local_buf[0xf]);
  }
  else {
    std::__cxx11::string::operator+=((string *)&local_38,"\\u");
    ec_to_text::anon_class_8_1_69789889::operator()(&local_60,(short)str.field_2._M_local_buf[0xf]);
  }
  std::__cxx11::string::operator+=((string *)&local_38,"\'");
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pcVar1 = strdup(pcVar1);
  Text::Text((Text *)this,pcVar1);
  std::__cxx11::string::~string((string *)&local_38);
  return (Text)(char *)this;
}

Assistant:

Text ec_to_text(char c)
	{
		// Add quotes around the character to make it obvious where it begin and ends.
		std::string str = "'";

		auto write_hex_digit = [&](unsigned num)
		{
			if (num < 10u) { str += char('0' + num); }
			else           { str += char('a' + num - 10); }
		};

		auto write_hex_16 = [&](uint16_t n)
		{
			write_hex_digit((n >> 12u) & 0x0f);
			write_hex_digit((n >>  8u) & 0x0f);
			write_hex_digit((n >>  4u) & 0x0f);
			write_hex_digit((n >>  0u) & 0x0f);
		};

		if      (c == '\\') { str += "\\\\"; }
		else if (c == '\"') { str += "\\\""; }
		else if (c == '\'') { str += "\\\'"; }
		else if (c == '\0') { str += "\\0";  }
		else if (c == '\b') { str += "\\b";  }
		else if (c == '\f') { str += "\\f";  }
		else if (c == '\n') { str += "\\n";  }
		else if (c == '\r') { str += "\\r";  }
		else if (c == '\t') { str += "\\t";  }
		else if (0 <= c && c < 0x20) {
			str += "\\u";
			write_hex_16(static_cast<uint16_t>(c));
		} else { str += c; }

		str += "'";

		return Text{STRDUP(str.c_str())};
	}